

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

void Extra_SymmPairsPrint(Extra_SymmInfo_t *p)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  putchar(10);
  uVar5 = 1;
  for (lVar1 = 0; lVar1 < p->nVars; lVar1 = lVar1 + 1) {
    uVar3 = uVar5 & 0xffffffff;
    while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), uVar4 = uVar5, iVar2 != 0) {
      putchar(0x20);
    }
    for (; (int)uVar4 < p->nVars; uVar4 = uVar4 + 1) {
      putchar((uint)(p->pSymms[lVar1][uVar4] != '\0') * 3 + 0x2e);
    }
    putchar(10);
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void Extra_SymmPairsPrint( Extra_SymmInfo_t * p )
{
    int i, k;
    printf( "\n" );
    for ( i = 0; i < p->nVars; i++ )
    {
        for ( k = 0; k <= i; k++ )
            printf( " " );
        for ( k = i+1; k < p->nVars; k++ )
            if ( p->pSymms[i][k] )
                printf( "1" );
            else
                printf( "." );
        printf( "\n" );
    }
}